

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O0

void __thiscall DIS::AggregateStatePdu::AggregateStatePdu(AggregateStatePdu *this)

{
  AggregateStatePdu *this_local;
  
  EntityManagementFamilyPdu::EntityManagementFamilyPdu(&this->super_EntityManagementFamilyPdu);
  (this->super_EntityManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__AggregateStatePdu_002713b8;
  EntityID::EntityID(&this->_aggregateID);
  this->_forceID = '\0';
  this->_aggregateState = '\0';
  EntityType::EntityType(&this->_aggregateType);
  this->_formation = 0;
  AggregateMarking::AggregateMarking(&this->_aggregateMarking);
  Vector3Float::Vector3Float(&this->_dimensions);
  Orientation::Orientation(&this->_orientation);
  Vector3Double::Vector3Double(&this->_centerOfMass);
  Vector3Float::Vector3Float(&this->_velocity);
  this->_numberOfDisAggregates = 0;
  this->_numberOfDisEntities = 0;
  this->_numberOfSilentAggregateTypes = 0;
  this->_numberOfSilentEntityTypes = 0;
  std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::vector(&this->_aggregateIDList);
  std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::vector(&this->_entityIDList);
  this->_pad2 = '\0';
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::vector
            (&this->_silentAggregateSystemList);
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::vector
            (&this->_silentEntitySystemList);
  this->_numberOfVariableDatumRecords = 0;
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_variableDatumList);
  Pdu::setPduType((Pdu *)this,'!');
  return;
}

Assistant:

AggregateStatePdu::AggregateStatePdu() : EntityManagementFamilyPdu(),
   _aggregateID(), 
   _forceID(0), 
   _aggregateState(0), 
   _aggregateType(), 
   _formation(0), 
   _aggregateMarking(), 
   _dimensions(), 
   _orientation(), 
   _centerOfMass(), 
   _velocity(), 
   _numberOfDisAggregates(0), 
   _numberOfDisEntities(0), 
   _numberOfSilentAggregateTypes(0), 
   _numberOfSilentEntityTypes(0), 
   _pad2(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 33 );
}